

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  WhereLoop *pLoop_00;
  sqlite3 *db_00;
  u8 uVar1;
  int iVar2;
  int iVar3;
  InLoop *pIVar4;
  int local_90;
  int iCol;
  int iOut;
  int iMap;
  sqlite3 *db;
  int *aiMap;
  int nEq;
  int i;
  WhereLoop *pLoop;
  InLoop *pIn;
  int local_50;
  int iTab;
  int eType;
  int iReg;
  Vdbe *v;
  Expr *pX;
  uint local_30;
  int iTarget_local;
  int bRev_local;
  int iEq_local;
  WhereLevel *pLevel_local;
  WhereTerm *pTerm_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pTerm->pExpr;
  _eType = pParse->pVdbe;
  pX._4_4_ = iTarget;
  local_30 = bRev;
  iTarget_local = iEq;
  _bRev_local = pLevel;
  pLevel_local = (WhereLevel *)pTerm;
  pTerm_local = (WhereTerm *)pParse;
  if ((*(u8 *)&v->db == '5') || (*(u8 *)&v->db == '-')) {
    iTab = sqlite3ExprCodeTarget(pParse,(Expr *)v->pParse,iTarget);
  }
  else {
    iTab = iTarget;
    if (*(u8 *)&v->db == '2') {
      sqlite3VdbeAddOp2(_eType,0x49,0,iTarget);
    }
    else {
      local_50 = 5;
      pLoop_00 = pLevel->pWLoop;
      aiMap._0_4_ = 0;
      db = (sqlite3 *)0x0;
      if ((((pLoop_00->wsFlags & 0x400) == 0) && ((pLoop_00->u).btree.pIndex != (Index *)0x0)) &&
         (((pLoop_00->u).btree.pIndex)->aSortOrder[iEq] != '\0')) {
        local_30 = (uint)((bRev != 0 ^ 0xffU) & 1);
      }
      for (aiMap._4_4_ = 0; iVar2 = iEq, aiMap._4_4_ < iEq; aiMap._4_4_ = aiMap._4_4_ + 1) {
        if ((pLoop_00->aLTerm[aiMap._4_4_] != (WhereTerm *)0x0) &&
           ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v)) {
          disableTerm(pLevel,pTerm);
          return pX._4_4_;
        }
      }
      while (aiMap._4_4_ = iVar2, aiMap._4_4_ < (int)(uint)pLoop_00->nLTerm) {
        if ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v) {
          aiMap._0_4_ = (int)aiMap + 1;
        }
        iVar2 = aiMap._4_4_ + 1;
      }
      pIn._4_4_ = 0;
      if ((((ulong)v->db & 0x80000000000) == 0) ||
         (((anon_union_8_2_a01b6dbf_for_x *)&v->nVar)->pSelect->pEList->nExpr == 1)) {
        local_50 = sqlite3FindInIndex(pParse,(Expr *)v,4,(int *)0x0,(int *)0x0,
                                      (int *)((long)&pIn + 4));
      }
      else {
        db_00 = pParse->db;
        v = (Vdbe *)removeUnindexableInClauseTerms(pParse,iEq,pLoop_00,(Expr *)v);
        if (db_00->mallocFailed == '\0') {
          db = (sqlite3 *)sqlite3DbMallocZero((sqlite3 *)pTerm_local->pExpr,(long)(int)aiMap << 2);
          local_50 = sqlite3FindInIndex((Parse *)pTerm_local,(Expr *)v,4,(int *)0x0,(int *)db,
                                        (int *)((long)&pIn + 4));
          *(int *)(*(long *)pLevel_local + 0x2c) = pIn._4_4_;
        }
        sqlite3ExprDelete(db_00,(Expr *)v);
        v = *(Vdbe **)pLevel_local;
      }
      if (local_50 == 4) {
        local_30 = (uint)((local_30 != 0 ^ 0xffU) & 1);
      }
      iVar2 = 0x24;
      if (local_30 != 0) {
        iVar2 = 0x20;
      }
      sqlite3VdbeAddOp2(_eType,iVar2,pIn._4_4_,0);
      pLoop_00->wsFlags = pLoop_00->wsFlags | 0x800;
      if ((_bRev_local->u).in.nIn == 0) {
        iVar2 = sqlite3VdbeMakeLabel((Parse *)pTerm_local);
        _bRev_local->addrNxt = iVar2;
      }
      iVar2 = (_bRev_local->u).in.nIn;
      (_bRev_local->u).in.nIn = (int)aiMap + (_bRev_local->u).in.nIn;
      pIVar4 = (InLoop *)
               sqlite3DbReallocOrFree
                         ((sqlite3 *)pTerm_local->pExpr,(_bRev_local->u).in.aInLoop,
                          (long)(_bRev_local->u).in.nIn * 0x14);
      (_bRev_local->u).in.aInLoop = pIVar4;
      pIVar4 = (_bRev_local->u).in.aInLoop;
      if (pIVar4 == (InLoop *)0x0) {
        (_bRev_local->u).in.nIn = 0;
      }
      else {
        iCol = 0;
        pLoop = (WhereLoop *)(pIVar4 + iVar2);
        for (aiMap._4_4_ = iTarget_local; aiMap._4_4_ < (int)(uint)pLoop_00->nLTerm;
            aiMap._4_4_ = aiMap._4_4_ + 1) {
          if ((Vdbe *)pLoop_00->aLTerm[aiMap._4_4_]->pExpr == v) {
            iVar2 = (iTab + aiMap._4_4_) - iTarget_local;
            if (local_50 == 1) {
              iVar3 = sqlite3VdbeAddOp2(_eType,0x80,pIn._4_4_,iVar2);
              *(int *)((long)&pLoop->prereq + 4) = iVar3;
            }
            else {
              if (db == (sqlite3 *)0x0) {
                local_90 = 0;
              }
              else {
                local_90 = db->aLimit[(long)iCol + -0x1f];
                iCol = iCol + 1;
              }
              iVar3 = sqlite3VdbeAddOp3(_eType,0x5a,pIn._4_4_,local_90,iVar2);
              *(int *)((long)&pLoop->prereq + 4) = iVar3;
            }
            sqlite3VdbeAddOp1(_eType,0x32,iVar2);
            if (aiMap._4_4_ == iTarget_local) {
              *(int *)&pLoop->prereq = pIn._4_4_;
              uVar1 = '\x05';
              if (local_30 != 0) {
                uVar1 = '\x04';
              }
              pLoop->iTab = uVar1;
              if ((iTarget_local < 1) || ((pLoop_00->wsFlags & 0x400) != 0)) {
                *(undefined4 *)((long)&pLoop->maskSelf + 4) = 0;
              }
              else {
                *(int *)&pLoop->maskSelf = iTab - aiMap._4_4_;
                *(int *)((long)&pLoop->maskSelf + 4) = aiMap._4_4_;
                pLoop_00->wsFlags = pLoop_00->wsFlags | 0x40000;
              }
            }
            else {
              pLoop->iTab = 0xaa;
            }
            pLoop = (WhereLoop *)&pLoop->rRun;
          }
        }
      }
      sqlite3DbFree((sqlite3 *)pTerm_local->pExpr,db);
    }
  }
  disableTerm(_bRev_local,(WhereTerm *)pLevel_local);
  return iTab;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
        pTerm->pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}